

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
ContainsFailure::ContainsFailure
          (ContainsFailure *this,UtestShell *test,char *fileName,int lineNumber,
          SimpleString *expected,SimpleString *actual,SimpleString *text)

{
  SimpleString *this_00;
  SimpleString *rhs;
  undefined4 in_ECX;
  UtestShell *in_RDX;
  TestFailure *in_RSI;
  undefined8 *in_RDI;
  SimpleString *in_R8;
  SimpleString *in_R9;
  SimpleString *in_stack_ffffffffffffff98;
  SimpleString *in_stack_ffffffffffffffa0;
  char local_50 [16];
  SimpleString *in_stack_ffffffffffffffc0;
  TestFailure *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  
  TestFailure::TestFailure
            (in_RSI,in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
             (int)((ulong)in_R8 >> 0x20));
  *in_RDI = &PTR__ContainsFailure_0025da38;
  TestFailure::createUserText(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  SimpleString::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  SimpleString::~SimpleString((SimpleString *)0x211022);
  this_00 = (SimpleString *)SimpleString::asCharString(in_R9);
  rhs = (SimpleString *)SimpleString::asCharString(in_R8);
  StringFromFormat(local_50,"actual <%s>\n\tdid not contain  <%s>",this_00,rhs);
  SimpleString::operator+=(this_00,rhs);
  SimpleString::~SimpleString((SimpleString *)0x211080);
  return;
}

Assistant:

ContainsFailure::ContainsFailure(UtestShell* test, const char* fileName, int lineNumber, const SimpleString& expected, const SimpleString& actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += StringFromFormat("actual <%s>\n\tdid not contain  <%s>", actual.asCharString(), expected.asCharString());
}